

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateCloningCode
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *descriptor;
  mapped_type *pmVar1;
  FieldGeneratorBase *pFVar2;
  Descriptor *pDVar3;
  FieldDescriptor *descriptor_00;
  long lVar4;
  long lVar5;
  long lVar6;
  allocator<char> local_b1;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator_1;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  class_name_abi_cxx11_((string *)&generator,this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"class_name",(allocator<char> *)&generator_1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_80);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&generator);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&generator);
  io::Printer::Print(printer,&vars,"public $class_name$($class_name$ other) : this() {\n");
  io::Printer::Indent(printer);
  lVar5 = 0;
  for (lVar4 = 0; pDVar3 = this->descriptor_, lVar4 < *(int *)(pDVar3 + 0x2c); lVar4 = lVar4 + 1) {
    if (*(long *)(*(long *)(pDVar3 + 0x30) + 0x60 + lVar5) == 0) {
      generator.ptr_ =
           CreateFieldGeneratorInternal(this,(FieldDescriptor *)(*(long *)(pDVar3 + 0x30) + lVar5));
      pFVar2 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
               operator->(&generator);
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[2])(pFVar2,printer);
      if (generator.ptr_ != (FieldGeneratorBase *)0x0) {
        (*((generator.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
      }
    }
    lVar5 = lVar5 + 0xa8;
  }
  for (lVar4 = 0; lVar4 < *(int *)(pDVar3 + 0x38); lVar4 = lVar4 + 1) {
    lVar5 = lVar4 * 0x30;
    UnderscoresToCamelCase
              ((string *)&generator,*(string **)(*(long *)(pDVar3 + 0x40) + lVar5),false);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"name",(allocator<char> *)&generator_1);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_80);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&generator);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&generator);
    UnderscoresToCamelCase
              ((string *)&generator,*(string **)(*(long *)(this->descriptor_ + 0x40) + lVar5),true);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"property_name",(allocator<char> *)&generator_1);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_80);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&generator);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&generator);
    io::Printer::Print(printer,&vars,"switch (other.$property_name$Case) {\n");
    io::Printer::Indent(printer);
    for (lVar6 = 0; lVar6 < *(int *)(*(long *)(this->descriptor_ + 0x40) + 0x1c + lVar5);
        lVar6 = lVar6 + 1) {
      descriptor = *(FieldDescriptor **)
                    (*(long *)(*(long *)(this->descriptor_ + 0x40) + lVar5 + 0x20) + lVar6 * 8);
      generator_1.ptr_ = CreateFieldGeneratorInternal(this,descriptor);
      GetPropertyName_abi_cxx11_((string *)&generator,(csharp *)descriptor,descriptor_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"field_property_name",&local_b1);
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_80);
      std::__cxx11::string::operator=((string *)pmVar1,(string *)&generator);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&generator);
      io::Printer::Print(printer,&vars,"case $property_name$OneofCase.$field_property_name$:\n");
      io::Printer::Indent(printer);
      pFVar2 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
               operator->(&generator_1);
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[2])(pFVar2,printer);
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      if (generator_1.ptr_ != (FieldGeneratorBase *)0x0) {
        (*((generator_1.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
      }
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
    pDVar3 = this->descriptor_;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public $class_name$ Clone() {\n  return new $class_name$(this);\n}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateCloningCode(io::Printer* printer) {
  map<string, string> vars;
  WriteGeneratedCodeAttributes(printer);
  vars["class_name"] = class_name();
    printer->Print(
    vars,
    "public $class_name$($class_name$ other) : this() {\n");
  printer->Indent();
  // Clone non-oneof fields first
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      scoped_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
      generator->GenerateCloningCode(printer);
    }
  }
  // Clone just the right field for each oneof
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    vars["name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(
        descriptor_->oneof_decl(i)->name(), true);
    printer->Print(vars, "switch (other.$property_name$Case) {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      scoped_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
      vars["field_property_name"] = GetPropertyName(field);
      printer->Print(
          vars,
          "case $property_name$OneofCase.$field_property_name$:\n");
      printer->Indent();
      generator->GenerateCloningCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }

  printer->Outdent();
  printer->Print("}\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public $class_name$ Clone() {\n"
    "  return new $class_name$(this);\n"
    "}\n\n");
}